

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTBase::configureTestSpecificObjects
          (TextureCubeMapArrayTextureSizeRTBase *this)

{
  deUint32 dVar1;
  RenderContext *pRVar2;
  GLint extraout_var;
  undefined1 local_28 [8];
  GLint rt_data [4];
  Functions *gl;
  TextureCubeMapArrayTextureSizeRTBase *this_local;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.m_context)
  ;
  rt_data[2] = (*pRVar2->_vptr_RenderContext[3])();
  rt_data[3] = extraout_var;
  memset(local_28,0,0x10);
  (**(code **)(rt_data._8_8_ + 0x6f8))(1,&this->m_rt_std_id);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x43e);
  (**(code **)(rt_data._8_8_ + 8))(0x84c0);
  (**(code **)(rt_data._8_8_ + 0xb8))(0xde1,this->m_rt_std_id);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x442);
  (**(code **)(rt_data._8_8_ + 0x1380))(0xde1,1,0x8d70,1);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error allocating storage for texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x445);
  (**(code **)(rt_data._8_8_ + 0x13b8))(0xde1,0,0,0,1,1,0x8d99,0x1405,local_28);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error filling texture object\'s data store with data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x448);
  (**(code **)(rt_data._8_8_ + 0x1360))(0xde1,0x2800,0x2600);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error setting texture object\'s filter mode!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,1099);
  (**(code **)(rt_data._8_8_ + 0x1360))(0xde1,0x2801,0x2600);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error setting texture object\'s filter mode!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x44d);
  (**(code **)(rt_data._8_8_ + 0x6f8))(1,&this->m_rt_shw_id);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x451);
  (**(code **)(rt_data._8_8_ + 8))(0x84c1);
  (**(code **)(rt_data._8_8_ + 0xb8))(0xde1,this->m_rt_shw_id);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x455);
  (**(code **)(rt_data._8_8_ + 0x1380))(0xde1,1,0x8d70,1);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error allocating storage for texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x458);
  (**(code **)(rt_data._8_8_ + 0x13b8))(0xde1,0,0,0,1,1,0x8d99,0x1405,local_28);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error filling texture object\'s data store with data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x45b);
  (**(code **)(rt_data._8_8_ + 0x1360))(0xde1,0x2800,0x2600);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error setting texture object\'s filter mode!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x45e);
  (**(code **)(rt_data._8_8_ + 0x1360))(0xde1,0x2801,0x2600);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error setting texture object\'s filter mode!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x460);
  (**(code **)(rt_data._8_8_ + 0x6d0))(1,&this->m_read_fbo_id);
  dVar1 = (**(code **)(rt_data._8_8_ + 0x800))();
  glu::checkError(dVar1,"Error generating frame buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x464);
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTBase::configureTestSpecificObjects(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint rt_data[m_n_rt_components];
	memset(rt_data, 0, m_n_rt_components * sizeof(glw::GLuint));

	/* Create texture which will store result of textureSize() for samplerCubeArray sampler */
	gl.genTextures(1, &m_rt_std_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_rt_std_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32UI, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");

	gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 1, 1, GL_RGBA_INTEGER, GL_UNSIGNED_INT, rt_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture object's data store with data!");

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture object's filter mode!");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture object's filter mode!");

	/* Create texture which will store result of textureSize() for samplerCubeArrayShadow sampler */
	gl.genTextures(1, &m_rt_shw_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	gl.activeTexture(GL_TEXTURE1);
	gl.bindTexture(GL_TEXTURE_2D, m_rt_shw_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32UI, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");

	gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 1, 1, GL_RGBA_INTEGER, GL_UNSIGNED_INT, rt_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture object's data store with data!");

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture object's filter mode!");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture object's filter mode!");

	/* Generate frame buffer object */
	gl.genFramebuffers(1, &m_read_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating frame buffer object!");
}